

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InterpreterStackFrame.cpp
# Opt level: O3

void __thiscall
Js::InterpreterStackFrame::
OP_LdArrAtomic<Js::OpLayoutT_WasmMemAccess<Js::LayoutSizePolicy<(Js::LayoutSize)2>>__unaligned>
          (InterpreterStackFrame *this,
          OpLayoutT_WasmMemAccess<Js::LayoutSizePolicy<(Js::LayoutSize)2>_> *playout)

{
  uint uVar1;
  code *pcVar2;
  bool bVar3;
  char cVar4;
  byte bVar5;
  unsigned_short uVar6;
  short sVar7;
  uint byteLength;
  int iVar8;
  uint uVar9;
  undefined4 *puVar10;
  WebAssemblyMemory *this_00;
  ArrayBufferBase *pAVar11;
  undefined4 extraout_var;
  unsigned_short *puVar12;
  uint *puVar13;
  int *piVar14;
  long *buffer_00;
  short *psVar15;
  ulong uVar16;
  long lVar17;
  ulong uVar18;
  byte *buffer;
  
  bVar3 = Wasm::Threads::IsEnabled();
  if (!bVar3) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar10 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar10 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/InterpreterStackFrame.cpp"
                                ,0x2356,"(Wasm::Threads::IsEnabled())","Wasm::Threads::IsEnabled()")
    ;
    if (!bVar3) goto LAB_00a68900;
    *puVar10 = 0;
  }
  if (TYPE_UINT32_TO_INT64 < playout->ViewType) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar10 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar10 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/InterpreterStackFrame.cpp"
                                ,0x2357,"(playout->ViewType < Js::ArrayBufferView::TYPE_COUNT)",
                                "playout->ViewType < Js::ArrayBufferView::TYPE_COUNT");
    if (!bVar3) goto LAB_00a68900;
    *puVar10 = 0;
  }
  uVar9 = playout->Offset;
  uVar1 = *(uint *)(*(long *)(this + 0x118) + (ulong)playout->SlotIndex * 4);
  this_00 = GetWebAssemblyMemory(this);
  pAVar11 = WebAssemblyMemory::GetBuffer(this_00);
  byteLength = (*(pAVar11->super_DynamicObject).super_RecyclableObject.super_FinalizableObject.
                 super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject[0x71])(pAVar11);
  iVar8 = (*(pAVar11->super_DynamicObject).super_RecyclableObject.super_FinalizableObject.
            super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject[0x72])(pAVar11);
  buffer = (byte *)CONCAT44(extraout_var,iVar8);
  if (TYPE_UINT32_TO_INT64 < playout->ViewType) {
switchD_00a6869c_caseD_6:
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar10 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar10 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/InterpreterStackFrame.cpp"
                                ,0x2367,"((0))","UNREACHED");
    if (bVar3) {
      *puVar10 = 0;
      return;
    }
LAB_00a68900:
    pcVar2 = (code *)invalidInstructionException();
    (*pcVar2)();
  }
  uVar18 = (ulong)uVar1 + (ulong)uVar9;
  switch(playout->ViewType) {
  case TYPE_INT8:
    if (byteLength <= uVar18) {
LAB_00a68902:
      JavascriptError::ThrowWebAssemblyRuntimeError
                (*(ScriptContext **)(this + 0x78),-0x7ff5e497,(PCWSTR)0x0);
    }
    cVar4 = AtomicsOperations::Load<char>((char *)(buffer + uVar18));
    uVar1 = playout->Value;
    uVar9 = (uint)cVar4;
    goto LAB_00a68847;
  case TYPE_UINT8:
    if (byteLength <= uVar18) goto LAB_00a68902;
    bVar5 = AtomicsOperations::Load<unsigned_char>(buffer + uVar18);
    uVar1 = playout->Value;
    uVar9 = (uint)bVar5;
LAB_00a68847:
    uVar18 = (ulong)uVar1;
    lVar17 = *(long *)(this + 0x118);
    goto LAB_00a68852;
  case TYPE_INT16:
    psVar15 = WasmAtomicsArrayBoundsCheck<short>(this,buffer,uVar18,byteLength);
    sVar7 = AtomicsOperations::Load<short>(psVar15);
    uVar18 = (ulong)playout->Value;
    uVar9 = (uint)sVar7;
    goto LAB_00a68820;
  case TYPE_UINT16:
    puVar12 = WasmAtomicsArrayBoundsCheck<unsigned_short>(this,buffer,uVar18,byteLength);
    uVar6 = AtomicsOperations::Load<unsigned_short>(puVar12);
    uVar18 = (ulong)playout->Value;
    uVar9 = (uint)uVar6;
    goto LAB_00a68820;
  case TYPE_INT32:
    piVar14 = WasmAtomicsArrayBoundsCheck<int>(this,buffer,uVar18,byteLength);
    uVar9 = AtomicsOperations::Load<int>(piVar14);
    goto LAB_00a6874e;
  case TYPE_UINT32:
    puVar13 = WasmAtomicsArrayBoundsCheck<unsigned_int>(this,buffer,uVar18,byteLength);
    uVar9 = AtomicsOperations::Load<unsigned_int>(puVar13);
LAB_00a6874e:
    uVar18 = (ulong)playout->Value;
LAB_00a68820:
    lVar17 = *(long *)(this + 0x118);
LAB_00a68852:
    *(uint *)(lVar17 + uVar18 * 4) = uVar9;
    return;
  default:
    goto switchD_00a6869c_caseD_6;
  case TYPE_INT64:
    buffer_00 = WasmAtomicsArrayBoundsCheck<long>(this,buffer,uVar18,byteLength);
    uVar18 = AtomicsOperations::Load<long>(buffer_00);
    uVar16 = (ulong)playout->Value;
    break;
  case TYPE_INT8_TO_INT64:
    if (byteLength <= uVar18) goto LAB_00a68902;
    cVar4 = AtomicsOperations::Load<char>((char *)(buffer + uVar18));
    uVar9 = playout->Value;
    uVar18 = (ulong)cVar4;
    goto LAB_00a688e2;
  case TYPE_UINT8_TO_INT64:
    if (byteLength <= uVar18) goto LAB_00a68902;
    bVar5 = AtomicsOperations::Load<unsigned_char>(buffer + uVar18);
    uVar9 = playout->Value;
    uVar18 = (ulong)bVar5;
LAB_00a688e2:
    uVar16 = (ulong)uVar9;
    lVar17 = *(long *)(this + 0x120);
    goto LAB_00a688ed;
  case TYPE_INT16_TO_INT64:
    psVar15 = WasmAtomicsArrayBoundsCheck<short>(this,buffer,uVar18,byteLength);
    sVar7 = AtomicsOperations::Load<short>(psVar15);
    uVar16 = (ulong)playout->Value;
    uVar18 = (ulong)sVar7;
    break;
  case TYPE_UINT16_TO_INT64:
    puVar12 = WasmAtomicsArrayBoundsCheck<unsigned_short>(this,buffer,uVar18,byteLength);
    uVar6 = AtomicsOperations::Load<unsigned_short>(puVar12);
    uVar16 = (ulong)playout->Value;
    uVar18 = (ulong)uVar6;
    break;
  case TYPE_INT32_TO_INT64:
    piVar14 = WasmAtomicsArrayBoundsCheck<int>(this,buffer,uVar18,byteLength);
    iVar8 = AtomicsOperations::Load<int>(piVar14);
    uVar16 = (ulong)playout->Value;
    uVar18 = (ulong)iVar8;
    break;
  case TYPE_UINT32_TO_INT64:
    puVar13 = WasmAtomicsArrayBoundsCheck<unsigned_int>(this,buffer,uVar18,byteLength);
    uVar9 = AtomicsOperations::Load<unsigned_int>(puVar13);
    uVar16 = (ulong)playout->Value;
    uVar18 = (ulong)uVar9;
  }
  lVar17 = *(long *)(this + 0x120);
LAB_00a688ed:
  *(ulong *)(lVar17 + uVar16 * 8) = uVar18;
  return;
}

Assistant:

void InterpreterStackFrame::OP_LdArrAtomic(const unaligned T* playout)
    {
#ifdef ENABLE_WASM
        Assert(Wasm::Threads::IsEnabled());
        Assert(playout->ViewType < Js::ArrayBufferView::TYPE_COUNT);
        const uint64 index = playout->Offset + (uint64)(uint32)GetRegRawInt(playout->SlotIndex);
        ArrayBufferBase* arr = GetWebAssemblyMemory()->GetBuffer();

        uint32 byteLength = arr->GetByteLength();
        BYTE* buffer = arr->GetBuffer();
        switch (playout->ViewType)
        {
#define ARRAYBUFFER_VIEW_INT(name, align, RegType, MemType, ...) \
        case ArrayBufferView::ViewType::TYPE_##name: {\
            MemType* readBuffer = WasmAtomicsArrayBoundsCheck<MemType>(buffer, index, byteLength); \
            MemType value = AtomicsOperations::Load<MemType>(readBuffer); \
            SetRegRaw<RegType>(playout->Value, (RegType)value); \
            return; \
        }
#include "AsmJsArrayBufferViews.h"
        default:Assert(UNREACHED);
        }
#else
        Assert(UNREACHED);
#endif
    }